

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O3

string * __thiscall
duckdb::NumericStatsUnifier<duckdb::timestamp_t>::StatsToString
          (string *__return_storage_ptr__,NumericStatsUnifier<duckdb::timestamp_t> *this,
          string *stats)

{
  Value local_50 [64];
  
  if (stats->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    duckdb::Value::CreateValue<duckdb::timestamp_t>((timestamp_t)local_50);
    duckdb::Value::ToString_abi_cxx11_();
    duckdb::Value::~Value(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string StatsToString(const string &stats) override {
		if (stats.empty()) {
			return string();
		}
		return Value::CreateValue<T>(Load<T>(const_data_ptr_cast(stats.data()))).ToString();
	}